

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall
TimesAll<0,_0,_0>::propagate_z
          (TimesAll<0,_0,_0> *this,int64_t x_min,int64_t x_max,int64_t y_min,int64_t y_max)

{
  IntVar *pIVar1;
  int iVar2;
  Clause *pCVar3;
  Lit *pLVar4;
  int64_t m_v_1;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t m_v;
  long lVar8;
  Clause *pCVar9;
  long lVar10;
  
  lVar6 = y_min * x_min;
  lVar5 = x_min * y_max;
  lVar7 = y_min * x_max;
  lVar10 = y_max * x_max;
  lVar8 = lVar6;
  if (lVar5 < lVar6) {
    lVar8 = lVar5;
  }
  if (lVar7 < lVar8) {
    lVar8 = lVar7;
  }
  if (lVar10 < lVar8) {
    lVar8 = lVar10;
  }
  if (-500000000 < lVar8) {
    if (so.lazy) {
      pCVar3 = Reason_new(5);
      iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      pLVar4 = Clause::operator[](pCVar3,1);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      pLVar4 = Clause::operator[](pCVar3,2);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      pLVar4 = Clause::operator[](pCVar3,3);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      pLVar4 = Clause::operator[](pCVar3,4);
      pLVar4->x = iVar2;
    }
    else {
      pCVar3 = (Clause *)0x0;
    }
    pIVar1 = (this->z).var;
    if ((pIVar1->min).v < lVar8) {
      pCVar9 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar3 = pCVar9;
      }
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar8,pCVar3,1);
      if ((char)iVar2 == '\0') goto LAB_0018bab3;
    }
  }
  if (lVar6 - lVar5 != 0 && lVar5 <= lVar6) {
    lVar5 = lVar6;
  }
  if (lVar5 <= lVar7) {
    lVar5 = lVar7;
  }
  if (lVar5 <= lVar10) {
    lVar5 = lVar10;
  }
  pCVar9 = (Clause *)0x1;
  if (lVar5 < 500000000) {
    if (so.lazy == true) {
      pCVar3 = Reason_new(5);
      iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      pLVar4 = Clause::operator[](pCVar3,1);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      pLVar4 = Clause::operator[](pCVar3,2);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      pLVar4 = Clause::operator[](pCVar3,3);
      pLVar4->x = iVar2;
      iVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      pLVar4 = Clause::operator[](pCVar3,4);
      pLVar4->x = iVar2;
    }
    else {
      pCVar3 = (Clause *)0x0;
    }
    pIVar1 = (this->z).var;
    if (lVar5 < (pIVar1->max).v) {
      pCVar9 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar3 = pCVar9;
      }
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar5,pCVar3,1);
      if ((char)iVar2 == '\0') goto LAB_0018bab3;
    }
    pCVar9 = (Clause *)0x1;
  }
LAB_0018bab3:
  return SUB81(pCVar9,0);
}

Assistant:

bool propagate_z(const int64_t x_min, const int64_t x_max, const int64_t y_min,
									 const int64_t y_max) {
		// Computing all possible extreme points of x * y
		const int64_t prod_min_min = x_min * y_min;
		const int64_t prod_min_max = x_min * y_max;
		const int64_t prod_max_min = x_max * y_min;
		const int64_t prod_max_max = x_max * y_max;

		// New lower bound on z
		int64_t z_min_new = std::min(prod_min_min, prod_min_max);
		z_min_new = std::min(z_min_new, prod_max_min);
		z_min_new = std::min(z_min_new, prod_max_max);

		if (z_min_new > IntVar::min_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMin, z_min_new, reason);
		}

		// New upper bound on z
		int64_t z_max_new = std::max(prod_min_min, prod_min_max);
		z_max_new = std::max(z_max_new, prod_max_min);
		z_max_new = std::max(z_max_new, prod_max_max);

		if (z_max_new < IntVar::max_limit) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = x.getMinLit();
				(*reason)[2] = x.getMaxLit();
				(*reason)[3] = y.getMinLit();
				(*reason)[4] = y.getMaxLit();
			}
			setDom(z, setMax, z_max_new, reason);
		}

		return true;
	}